

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc_normalize.cpp
# Opt level: O0

ScalarFunction * duckdb::NFCNormalizeFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  allocator_type *in_stack_fffffffffffffe88;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe90;
  iterator in_stack_fffffffffffffe98;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffea0;
  LogicalTypeId in_stack_fffffffffffffeaf;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined1 **local_108;
  bind_scalar_function_t in_stack_ffffffffffffff68;
  scalar_function_t *in_stack_ffffffffffffff70;
  LogicalType *return_type;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff80;
  element_type *in_stack_ffffffffffffff88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff90;
  undefined1 *local_68;
  bind_scalar_function_extended_t bind_extended;
  function_statistics_t in_stack_ffffffffffffffa8;
  init_local_state_t in_stack_ffffffffffffffb0;
  LogicalType *in_stack_ffffffffffffffb8;
  FunctionStability in_stack_ffffffffffffffc0;
  FunctionNullHandling in_stack_ffffffffffffffc8;
  bind_lambda_function_t in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_28,"nfc_normalize",(allocator *)&stack0xffffffffffffffd7);
  return_type = (LogicalType *)&stack0xffffffffffffff80;
  LogicalType::LogicalType
            ((LogicalType *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffeaf);
  local_68 = &stack0xffffffffffffff80;
  bind_extended = (bind_scalar_function_extended_t)0x1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x13773df);
  iVar1._M_len = (size_type)in_stack_fffffffffffffea0;
  iVar1._M_array = in_stack_fffffffffffffe98;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffe90,iVar1,in_stack_fffffffffffffe88);
  LogicalType::LogicalType
            ((LogicalType *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffeaf);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (in_stack_fffffffffffffea0,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)in_stack_fffffffffffffe98);
  LogicalType::LogicalType
            ((LogicalType *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffeaf);
  ScalarFunction::ScalarFunction
            ((ScalarFunction *)in_stack_ffffffffffffff90._M_pi,(string *)in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,return_type,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,bind_extended,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
  LogicalType::~LogicalType((LogicalType *)0x13774b9);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x13774c6);
  LogicalType::~LogicalType((LogicalType *)0x13774d3);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x13774e0);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x13774ed);
  local_108 = &local_68;
  do {
    local_108 = local_108 + -3;
    LogicalType::~LogicalType((LogicalType *)0x1377516);
  } while (local_108 != (undefined1 **)&stack0xffffffffffffff80);
  ::std::__cxx11::string::~string(local_28);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return in_RDI;
}

Assistant:

ScalarFunction NFCNormalizeFun::GetFunction() {
	return ScalarFunction("nfc_normalize", {LogicalType::VARCHAR}, LogicalType::VARCHAR, NFCNormalizeFunction);
}